

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_alphamapblit_generic
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  DestFetchProc64 p_Var2;
  DestStoreProc64 p_Var3;
  QT_FT_Span *pQVar4;
  bool bVar5;
  int iVar6;
  QRgba64 *pQVar7;
  ulong uVar8;
  ClipLine *pCVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long in_FS_OFFSET;
  ushort uVar17;
  ushort uVar18;
  QRgba64 buffer [2048];
  uchar *local_4098;
  QRgba64 local_4088;
  QColorTrcLut *local_4080;
  QRgba64 local_4038 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_4088 = (QRgba64)color->rgba;
  if (local_4088.rgba >> 0x30 == 0) goto LAB_006535f8;
  if (useGammaCorrection) {
    local_4080 = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
    local_4088 = (QRgba64)color->rgba;
    if (local_4080 == (QColorTrcLut *)0x0) goto LAB_00653354;
    if ((short)(local_4088.rgba >> 0x30) == -1) {
      _Var1._M_head_impl =
           (local_4080->m_toLinear)._M_t.
           super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
           super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      uVar17 = (ushort)(local_4088.rgba >> 0x10);
      uVar18 = (ushort)(local_4088.rgba >> 0x20);
      local_4088.rgba =
           CONCAT26(0xffff,CONCAT24((_Var1._M_head_impl[(ushort)(uVar18 - (uVar18 >> 8)) >> 4] >> 8)
                                    + _Var1._M_head_impl[(ushort)(uVar18 - (uVar18 >> 8)) >> 4],
                                    CONCAT22((_Var1._M_head_impl
                                              [(ushort)(uVar17 - (uVar17 >> 8)) >> 4] >> 8) +
                                             _Var1._M_head_impl
                                             [(ushort)(uVar17 - (uVar17 >> 8)) >> 4],
                                             (_Var1._M_head_impl
                                              [(ushort)((ushort)local_4088.rgba -
                                                       ((ushort)local_4088.rgba >> 8)) >> 4] >> 8) +
                                             _Var1._M_head_impl
                                             [(ushort)((ushort)local_4088.rgba -
                                                      ((ushort)local_4088.rgba >> 8)) >> 4])));
    }
  }
  else {
LAB_00653354:
    local_4080 = (QColorTrcLut *)0x0;
  }
  p_Var2 = destFetchProc64[rasterBuffer->format];
  p_Var3 = destStoreProc64[rasterBuffer->format];
  if (clip == (QClipData *)0x0) {
    if (0 < mapHeight) {
      iVar6 = 0;
      local_4098 = map;
      do {
        if (0 < mapWidth) {
          iVar12 = x;
          uVar13 = mapWidth;
          do {
            uVar11 = 0x800;
            if (uVar13 < 0x800) {
              uVar11 = uVar13;
            }
            pQVar7 = (*p_Var2)(local_4038,rasterBuffer,iVar12,iVar6 + y,uVar11);
            qt_alphamapblit_generic_oneline
                      (local_4098 + ((long)iVar12 - (long)x),uVar11,local_4088,pQVar7,
                       (QRgba64)color->rgba,local_4080);
            if (p_Var3 != (DestStoreProc64)0x0) {
              (*p_Var3)(rasterBuffer,iVar12,iVar6 + y,pQVar7,uVar11);
            }
            iVar12 = iVar12 + uVar11;
            uVar14 = uVar13 - uVar11;
            bVar5 = (int)uVar11 <= (int)uVar13;
            uVar13 = uVar14;
          } while (uVar14 != 0 && bVar5);
        }
        local_4098 = local_4098 + mapStride;
        iVar6 = iVar6 + 1;
      } while (iVar6 != mapHeight);
    }
  }
  else {
    uVar13 = mapHeight + y;
    if (rasterBuffer->m_height <= mapHeight + y) {
      uVar13 = rasterBuffer->m_height;
    }
    uVar11 = 0;
    if (0 < y) {
      uVar11 = y;
    }
    QClipData::initialize(clip);
    if ((int)uVar11 < (int)uVar13) {
      uVar8 = (ulong)uVar11;
      local_4098 = map + (int)((uVar11 - y) * mapStride);
      do {
        if (0 < clip->m_clipLines[uVar8].count) {
          pCVar9 = clip->m_clipLines + uVar8;
          lVar15 = 8;
          lVar10 = 0;
          do {
            pQVar4 = pCVar9->spans;
            iVar6 = *(int *)((long)pQVar4 + lVar15 + -8);
            iVar12 = x;
            if (x < iVar6) {
              iVar12 = iVar6;
            }
            iVar6 = iVar6 + *(int *)((long)pQVar4 + lVar15 + -4);
            iVar16 = mapWidth + x;
            if (iVar6 <= mapWidth + x) {
              iVar16 = iVar6;
            }
            iVar6 = iVar16 - iVar12;
            if (iVar6 != 0 && iVar12 <= iVar16) {
              pQVar7 = (*p_Var2)(local_4038,rasterBuffer,iVar12,*(int *)((long)&pQVar4->x + lVar15),
                                 iVar6);
              qt_alphamapblit_generic_oneline
                        (local_4098 + ((long)iVar12 - (long)x),iVar6,local_4088,pQVar7,
                         (QRgba64)color->rgba,local_4080);
              if (p_Var3 != (DestStoreProc64)0x0) {
                (*p_Var3)(rasterBuffer,iVar12,*(int *)((long)&pQVar4->x + lVar15),pQVar7,iVar6);
              }
            }
            lVar10 = lVar10 + 1;
            lVar15 = lVar15 + 0x10;
          } while (lVar10 < pCVar9->count);
        }
        local_4098 = local_4098 + mapStride;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar13);
    }
  }
LAB_006535f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_generic(QRasterBuffer *rasterBuffer,
                                    int x, int y, const QRgba64 &color,
                                    const uchar *map,
                                    int mapWidth, int mapHeight, int mapStride,
                                    const QClipData *clip, bool useGammaCorrection)
{
    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    if (!clip) {
        for (int ly = 0; ly < mapHeight; ++ly) {
            int i = x;
            int length = mapWidth;
            while (length > 0) {
                int l = qMin(BufferSize, length);

                QRgba64 *dest = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                qt_alphamapblit_generic_oneline(map + i - x, l,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest, l);
                length -= l;
                i += l;
            }
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                if (end <= start)
                    continue;
                Q_ASSERT(end - start <= BufferSize);
                QRgba64 *dest = destFetch64(buffer, rasterBuffer, start, clip.y, end - start);
                qt_alphamapblit_generic_oneline(map + start - x, end - start,
                                                srcColor, dest, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, start, clip.y, dest, end - start);
            } // for (i -> line.count)
            map += mapStride;
        } // for (yp -> bottom)
    }
}